

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_s12.c
# Opt level: O0

void s12h_set_ext_params(xc_func_type *p,double *ext_params)

{
  hyb_gga_x_cam_s12_params *params;
  double sr_exx;
  double *in_stack_ffffffffffffffd8;
  xc_func_type *in_stack_ffffffffffffffe0;
  
  set_ext_params_cpy_cam(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void
s12h_set_ext_params(xc_func_type *p, const double *ext_params)
{
  gga_x_s12_params *params;

  assert(p != NULL && p->params != NULL);
  params = (gga_x_s12_params *) (p->params);

  params->A    = get_ext_param(p, ext_params, 0);
  params->B    = get_ext_param(p, ext_params, 1);
  params->C    = get_ext_param(p, ext_params, 2);
  params->D    = get_ext_param(p, ext_params, 3);
  params->E    = get_ext_param(p, ext_params, 4);

  p->cam_alpha = get_ext_param(p, ext_params, 5);
  params->bx   = 1.0 - p->cam_alpha;
}